

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latch.hpp
# Opt level: O2

void __thiscall gmlc::concurrency::Latch::arrive(Latch *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->mtx);
  LOCK();
  (this->counter_).super___atomic_base<int>._M_i =
       (this->counter_).super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((this->counter_).super___atomic_base<int>._M_i == 0) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return;
}

Assistant:

void arrive()
        {
            std::unique_lock<std::mutex> lck(mtx);
            --counter_;
            if (counter_ == 0) {
                cv.notify_all();
            }
        }